

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# updaterevision.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  int *piVar5;
  char **ppcVar6;
  bool bVar7;
  int needupdate;
  int gotrev;
  FILE *stream;
  char *hash;
  char lasthash [128];
  char lastlog [128];
  char vertag [128];
  char **argv_local;
  int argc_local;
  
  stream = (FILE *)0x0;
  bVar1 = false;
  bVar7 = true;
  lastlog[0x78] = '\0';
  lasthash[0x78] = '\0';
  if (argc == 2) {
    pFVar3 = popen("git describe --tags && git log -1 --format=%ai*%H","r");
    if (pFVar3 != (FILE *)0x0) {
      pcVar4 = fgets(lastlog + 0x78,0x80,pFVar3);
      if ((pcVar4 == lastlog + 0x78) &&
         (pcVar4 = fgets(lasthash + 0x78,0x80,pFVar3), pcVar4 == lasthash + 0x78)) {
        stripnl(lastlog + 0x78);
        stripnl(lasthash + 0x78);
        bVar1 = true;
      }
      pclose(pFVar3);
    }
    if ((bVar1) && (stream = (FILE *)strchr(lasthash + 0x78,0x2a), stream != (FILE *)0x0)) {
      *(char *)&stream->_flags = '\0';
      stream = (FILE *)((long)&stream->_flags + 1);
    }
    pFVar3 = _stderr;
    if (stream == (FILE *)0x0) {
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      fprintf(pFVar3,"Failed to get commit info: %s\n",pcVar4);
      strcpy(lastlog + 0x78,"<unknown version>");
      lasthash[0x78] = '\0';
      lasthash[0x79] = '0';
      lasthash[0x7a] = '\0';
      stream = (FILE *)(lasthash + 0x79);
    }
    pFVar3 = fopen(argv[1],"r");
    if (pFVar3 != (FILE *)0x0) {
      if (!bVar1) {
        fclose(pFVar3);
        return 0;
      }
      ppcVar6 = (char **)fgets((char *)&hash,0x80,pFVar3);
      if (ppcVar6 == &hash) {
        stripnl((char *)&hash);
        iVar2 = strcmp((char *)stream,(char *)((long)&hash + 3));
        bVar7 = iVar2 != 0;
      }
      fclose(pFVar3);
    }
    if (bVar7) {
      pFVar3 = fopen(argv[1],"w");
      if (pFVar3 == (FILE *)0x0) {
        return 1;
      }
      fprintf(pFVar3,
              "// %s\n//\n// This file was automatically generated by the\n// updaterevision tool. Do not edit by hand.\n\n#define GIT_DESCRIPTION \"%s\"\n#define GIT_HASH \"%s\"\n#define GIT_TIME \"%s\"\n"
              ,stream,lastlog + 0x78,stream,lasthash + 0x78);
      fclose(pFVar3);
      fprintf(_stderr,"%s updated to commit %s.\n",argv[1],lastlog + 0x78);
    }
    else {
      fprintf(_stderr,"%s is up to date at commit %s.\n",argv[1],lastlog + 0x78);
    }
    argv_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"Usage: %s <path to gitinfo.h>\n",*argv);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
	char vertag[128], lastlog[128], lasthash[128], *hash = NULL;
	FILE *stream = NULL;
	int gotrev = 0, needupdate = 1;

	vertag[0] = '\0';
	lastlog[0] = '\0';

	if (argc != 2)
	{
		fprintf(stderr, "Usage: %s <path to gitinfo.h>\n", argv[0]);
		return 1;
	}

	// Use git describe --tags to get a version string. If we are sitting directly
	// on a tag, it returns that tag. Otherwise it returns <most recent tag>-<number of
	// commits since the tag>-<short hash>.
	// Use git log to get the time of the latest commit in ISO 8601 format and its full hash.
	stream = popen("git describe --tags && git log -1 --format=%ai*%H", "r");

	if (NULL != stream)
	{
		if (fgets(vertag, sizeof vertag, stream) == vertag &&
			fgets(lastlog, sizeof lastlog, stream) == lastlog)
		{
			stripnl(vertag);
			stripnl(lastlog);
			gotrev = 1;
		}

		pclose(stream);
	}

	if (gotrev)
	{
		hash = strchr(lastlog, '*');
		if (hash != NULL)
		{
			*hash = '\0';
			hash++;
		}
	}
	if (hash == NULL)
	{
		fprintf(stderr, "Failed to get commit info: %s\n", strerror(errno));
		strcpy(vertag, "<unknown version>");
		lastlog[0] = '\0';
		lastlog[1] = '0';
		lastlog[2] = '\0';
		hash = lastlog + 1;
	}

	stream = fopen (argv[1], "r");
	if (stream != NULL)
	{
		if (!gotrev)
		{ // If we didn't get a revision but the file does exist, leave it alone.
			fclose (stream);
			return 0;
		}
		// Read the revision that's in this file already. If it's the same as
		// what we've got, then we don't need to modify it and can avoid rebuilding
		// dependant files.
		if (fgets(lasthash, sizeof lasthash, stream) == lasthash)
		{
			stripnl(lasthash);
			if (strcmp(hash, lasthash + 3) == 0)
			{
				needupdate = 0;
			}
		}
		fclose (stream);
	}

	if (needupdate)
	{
		stream = fopen (argv[1], "w");
		if (stream == NULL)
		{
			return 1;
		}
		fprintf(stream,
"// %s\n"
"//\n"
"// This file was automatically generated by the\n"
"// updaterevision tool. Do not edit by hand.\n"
"\n"
"#define GIT_DESCRIPTION \"%s\"\n"
"#define GIT_HASH \"%s\"\n"
"#define GIT_TIME \"%s\"\n",
			hash, vertag, hash, lastlog);
		fclose(stream);
		fprintf(stderr, "%s updated to commit %s.\n", argv[1], vertag);
	}
	else
	{
		fprintf (stderr, "%s is up to date at commit %s.\n", argv[1], vertag);
	}

	return 0;
}